

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  FieldOptions *this_01;
  InlinedStringField *this_02;
  ArenaStringPtr *this_03;
  string *psVar5;
  string *value;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    psVar5 = FieldDescriptor::default_value_string_abi_cxx11_(field);
    psVar5 = internal::ExtensionSet::GetString(this_00,number,psVar5);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if ((!bVar1) || (bVar1 = HasOneofField(this,message,field), bVar1)) {
      this_01 = FieldDescriptor::options(field);
      FieldOptions::ctype(this_01);
      bVar1 = IsInlined(this,field);
      if (bVar1) {
        this_02 = GetField<google::protobuf::internal::InlinedStringField>(this,message,field);
        psVar5 = internal::InlinedStringField::GetNoArena_abi_cxx11_(this_02);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
      }
      else {
        this_03 = GetField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        psVar5 = internal::ArenaStringPtr::GetPointer_abi_cxx11_(this_03);
        if (psVar5 == (string *)0x0) {
          psVar5 = FieldDescriptor::default_value_string_abi_cxx11_(field);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
        }
      }
    }
    else {
      psVar5 = FieldDescriptor::default_value_string_abi_cxx11_(field);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return field->default_value_string();
    }
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        if (auto* value =
                GetField<ArenaStringPtr>(message, field).GetPointer()) {
          return *value;
        }
        return field->default_value_string();
      }
    }
  }
}